

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

void __thiscall CLayer::CLayer(CLayer *this)

{
  _Rb_tree_header *p_Var1;
  
  CObject::CObject(&this->super_CObject);
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CLayer_00188ba0;
  (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header;
  (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __gnu_cxx::
  hash_map<long_long,_std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>_>_>
  ::hash_map(&this->m_CBoundaryBucketItr);
  this->m_iSumWL = 0;
  this->m_iMaxBY = 0;
  this->m_iMaxBX = 0;
  this->m_ppGrid = (CGrid **)0x0;
  this->m_ppBoundary = (CBoundary **)0x0;
  return;
}

Assistant:

CLayer::CLayer()
{
	m_ppGrid			=	NULL;
	m_ppBoundary		=	NULL;
	m_iSumWL			=	0;	
	m_iMaxBY			=	0;
	m_iMaxBX			=	0;
	//m_iTargetCapacity	=	-1;
	//m_dTargetCongestion	=	0;
}